

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool nite::isMouseInRegion(Vec2 *P,Vec2 *Q)

{
  bool bVar1;
  
  bVar1 = isMouseInRegion(P->x,P->y,Q->x,Q->y);
  return bVar1;
}

Assistant:

bool nite::isMouseInRegion(const nite::Vec2 &P, const nite::Vec2 &Q){
	return isMouseInRegion(P.x, P.y, Q.x, Q.y);
}